

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isUnion(Type *this)

{
  Type *pTVar1;
  
  pTVar1 = getCanonicalType(this);
  return ((pTVar1->super_Symbol).kind & ~Root) == PackedUnionType;
}

Assistant:

bool Type::isUnion() const {
    const Type& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::UnpackedUnionType:
        case SymbolKind::PackedUnionType:
            return true;
        default:
            return false;
    }
}